

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

SC_Cell * Abc_SclFindSmallestGate(SC_Cell *p,float CinMin)

{
  SC_Cell *p_00;
  SC_Cell *pSVar1;
  SC_Cell **ppSVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  
  iVar3 = 0;
  ppSVar2 = &p->pRepr;
  while( true ) {
    p_00 = *ppSVar2;
    bVar4 = iVar3 != 0;
    iVar3 = iVar3 + -1;
    if ((bVar4) && (pSVar1 = p->pRepr, p_00 == pSVar1)) break;
    fVar5 = SC_CellPinCapAve(p_00);
    if (CinMin < fVar5) {
      return p_00;
    }
    ppSVar2 = &p_00->pNext;
  }
  return pSVar1->pPrev;
}

Assistant:

SC_Cell * Abc_SclFindSmallestGate( SC_Cell * p, float CinMin )
{
    SC_Cell * pRes = NULL;
    int i;
    SC_RingForEachCell( p->pRepr, pRes, i )
        if ( SC_CellPinCapAve(pRes) > CinMin )
            return pRes;
    // take the largest gate
    return p->pRepr->pPrev;
}